

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::helper::
     fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (iterator Td,iterator SA,long i,long size)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_03;
  long lVar6;
  undefined4 extraout_var_05;
  pos_type pVar7;
  long lVar8;
  BitmapArray<long> *pBVar9;
  long lVar10;
  pos_type pVar11;
  BitmapArray<long> *pBVar12;
  long lVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  pVar11 = Td.pos_;
  pBVar12 = Td.array_;
  pVar7 = SA.pos_;
  pBVar9 = SA.array_;
  iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,i + pVar7);
  iVar3 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])(pBVar12,CONCAT44(extraout_var,iVar2) + pVar11);
  lVar10 = i * 2 + 1;
  if (lVar10 < size) {
    lVar1 = i * 2;
    lVar13 = i;
    do {
      iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,lVar10 + pVar7);
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_01,iVar4) + pVar11);
      lVar5 = CONCAT44(extraout_var_02,iVar4);
      iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar7 + lVar1 + 2);
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_03,iVar4) + pVar11);
      lVar6 = CONCAT44(extraout_var_04,iVar4);
      lVar8 = lVar5;
      if (lVar5 <= lVar6) {
        lVar8 = lVar6;
      }
      i = lVar13;
      if (lVar8 <= CONCAT44(extraout_var_00,iVar3)) break;
      i = lVar10;
      if (lVar5 < lVar6) {
        i = lVar1 + 2;
      }
      iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,i + pVar7);
      (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])
                (pBVar9,lVar13 + pVar7,CONCAT44(extraout_var_05,iVar4));
      lVar1 = i * 2;
      lVar10 = i * 2 + 1;
      lVar13 = i;
    } while (lVar10 < size);
  }
  (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,i + pVar7,CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}